

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

bool __thiscall sf::Font::loadFromFile(Font *this,string *filename)

{
  void *pvVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  ostream *poVar5;
  undefined8 uVar6;
  EVP_PKEY_CTX *in_RSI;
  Font *in_RDI;
  FT_Stroker stroker;
  FT_Face_conflict face;
  FT_Library library;
  bool local_52;
  allocator local_51;
  string local_50 [32];
  void *local_30;
  void *local_28;
  void *local_20;
  EVP_PKEY_CTX *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  cleanup(in_RDI,in_RSI);
  piVar4 = (int *)operator_new(4);
  *piVar4 = 1;
  in_RDI->m_refCount = piVar4;
  iVar3 = FT_Init_FreeType(&local_20);
  if (iVar3 == 0) {
    in_RDI->m_library = local_20;
    pvVar1 = in_RDI->m_library;
    uVar6 = std::__cxx11::string::c_str();
    iVar3 = FT_New_Face(pvVar1,uVar6,0,&local_28);
    if (iVar3 == 0) {
      iVar3 = FT_Stroker_New(in_RDI->m_library,&local_30);
      if (iVar3 == 0) {
        iVar3 = FT_Select_Charmap(local_28,0x756e6963);
        if (iVar3 == 0) {
          in_RDI->m_stroker = local_30;
          in_RDI->m_face = local_28;
          local_52 = *(long *)((long)local_28 + 0x28) == 0;
          if (local_52) {
            std::__cxx11::string::string(local_50);
          }
          else {
            pcVar2 = *(char **)((long)local_28 + 0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_50,pcVar2,&local_51);
          }
          local_52 = !local_52;
          std::__cxx11::string::operator=((string *)&in_RDI->m_info,local_50);
          std::__cxx11::string::~string(local_50);
          if (local_52) {
            std::allocator<char>::~allocator((allocator<char> *)&local_51);
          }
          local_1 = true;
        }
        else {
          poVar5 = err();
          poVar5 = std::operator<<(poVar5,"Failed to load font \"");
          poVar5 = std::operator<<(poVar5,(string *)local_18);
          poVar5 = std::operator<<(poVar5,"\" (failed to set the Unicode character set)");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          FT_Stroker_Done(local_30);
          FT_Done_Face(local_28);
          local_1 = false;
        }
      }
      else {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,"Failed to load font \"");
        poVar5 = std::operator<<(poVar5,(string *)local_18);
        poVar5 = std::operator<<(poVar5,"\" (failed to create the stroker)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        FT_Done_Face(local_28);
        local_1 = false;
      }
    }
    else {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,"Failed to load font \"");
      poVar5 = std::operator<<(poVar5,(string *)local_18);
      poVar5 = std::operator<<(poVar5,"\" (failed to create the font face)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
  }
  else {
    poVar5 = err();
    poVar5 = std::operator<<(poVar5,"Failed to load font \"");
    poVar5 = std::operator<<(poVar5,(string *)local_18);
    poVar5 = std::operator<<(poVar5,"\" (failed to initialize FreeType)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Font::loadFromFile(const std::string& filename)
{
    #ifndef SFML_SYSTEM_ANDROID

    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Load the new font face from the specified file
    FT_Face face;
    if (FT_New_Face(static_cast<FT_Library>(m_library), filename.c_str(), 0, &face) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to create the font face)" << std::endl;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        return false;
    }

    // Select the unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to set the Unicode character set)" << std::endl;
        FT_Stroker_Done(stroker);
        FT_Done_Face(face);
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;

    #else

    if (m_stream)
        delete static_cast<priv::ResourceStream*>(m_stream);

    m_stream = new priv::ResourceStream(filename);
    return loadFromStream(*static_cast<priv::ResourceStream*>(m_stream));

    #endif
}